

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O3

void __thiscall hwnet::TCPSocket::doClose(TCPSocket *this)

{
  sendContext *psVar1;
  int iVar2;
  _Manager_operation extraout_EDX;
  sendContext *c;
  sendContext *psVar3;
  _Any_data local_68;
  undefined1 auStack_58 [8];
  CloseCallback callback;
  
  callback.super__Function_base._M_functor._8_8_ = 0;
  callback.super__Function_base._M_manager = (_Manager_type)0x0;
  auStack_58 = (undefined1  [8])0x0;
  callback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if ((this->closeCallback_).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator=
              ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)auStack_58,
               &this->closeCallback_);
  }
  psVar3 = this->sendLists[0].head;
  if (psVar3 != (sendContext *)0x0) {
    do {
      psVar1 = psVar3->next;
      sendContextPool::put((sendContextPool *)sContextPool,psVar3);
      psVar3 = psVar1;
    } while (psVar1 != (sendContext *)0x0);
    this->sendLists[0].head = (sendContext *)0x0;
    this->sendLists[0].tail = (sendContext *)0x0;
  }
  psVar3 = this->sendLists[1].head;
  if (psVar3 != (sendContext *)0x0) {
    do {
      psVar1 = psVar3->next;
      sendContextPool::put((sendContextPool *)sContextPool,psVar3);
      psVar3 = psVar1;
    } while (psVar1 != (sendContext *)0x0);
    this->sendLists[1].head = (sendContext *)0x0;
    this->sendLists[1].tail = (sendContext *)0x0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  if (callback.super__Function_base._M_functor._8_8_ != 0) {
    std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::TCPSocket,void>
              ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)local_68._M_pod_data,
               (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<hwnet::TCPSocket>);
    if (callback.super__Function_base._M_functor._8_8_ == 0) {
      std::__throw_bad_function_call();
    }
    (*callback.super__Function_base._M_manager)((_Any_data *)auStack_58,&local_68,extraout_EDX);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
    }
    if (callback.super__Function_base._M_functor._8_8_ != 0) {
      (*(code *)callback.super__Function_base._M_functor._8_8_)(auStack_58,auStack_58,3);
    }
  }
  return;
}

Assistant:

void TCPSocket::doClose() {
	CloseCallback callback = nullptr;
	{
		std::lock_guard<std::mutex> guard(this->mtx);
		if(closeCallback_){
			callback = closeCallback_;
		}
		sendLists[0].clear();
		sendLists[1].clear();
	}

	if(callback) {
		callback(shared_from_this());
	}
}